

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

void __thiscall
ctemplate::TemplateCache::RefcountedTemplate::RefcountedTemplate
          (RefcountedTemplate *this,Template *ptr)

{
  Template *ptr_local;
  RefcountedTemplate *this_local;
  
  this->ptr_ = ptr;
  this->refcount_ = 1;
  Mutex::Mutex(&this->mutex_);
  return;
}

Assistant:

explicit RefcountedTemplate(const Template* ptr) : ptr_(ptr), refcount_(1) { }